

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::DtlsSession::SetClientTransportId(Error *__return_storage_ptr__,DtlsSession *this)

{
  bool bVar1;
  ByteArray *pBVar2;
  uchar *info;
  size_type ilen;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  ErrorCode local_174;
  Error local_170;
  anon_class_1_0_00000001 local_142;
  v10 local_141;
  v10 *local_140;
  size_t local_138;
  string local_130;
  Error local_110;
  undefined1 local_d8 [8];
  Address peerAddr;
  int fail;
  DtlsSession *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  if (((this->mIsServer & 1U) != 0) && ((this->mIsClientIdSet & 1U) == 0)) {
    peerAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    Error::Error(__return_storage_ptr__);
    (*(this->super_Endpoint)._vptr_Endpoint[3])(local_d8);
    bVar1 = Address::IsValid((Address *)local_d8);
    if (bVar1) {
      pBVar2 = Address::GetRaw((Address *)local_d8);
      info = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pBVar2);
      pBVar2 = Address::GetRaw((Address *)local_d8);
      ilen = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pBVar2);
      peerAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           mbedtls_ssl_set_client_transport_id(&this->mSsl,info,ilen);
      ErrorFromMbedtlsError
                (&local_170,
                 (int)peerAddr.mBytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      aError = Error::operator=(__return_storage_ptr__,&local_170);
      local_174 = kNone;
      bVar1 = commissioner::operator!=(aError,&local_174);
      Error::~Error(&local_170);
      if (!bVar1) {
        this->mIsClientIdSet = true;
      }
    }
    else {
      SetClientTransportId::anon_class_1_0_00000001::operator()(&local_142);
      local_58 = &local_140;
      local_60 = &local_141;
      bVar3 = ::fmt::v10::operator()(local_60);
      local_138 = bVar3.size_;
      local_140 = (v10 *)bVar3.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_68 = &local_130;
      local_78 = local_140;
      sStack_70 = local_138;
      local_50 = &local_78;
      local_88 = local_140;
      local_80 = local_138;
      local_48 = local_88;
      sStack_40 = local_80;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_30 = local_98;
      local_38 = &error;
      local_20 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_80;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_130,local_88,fmt,args);
      Error::Error(&local_110,kInvalidState,&local_130);
      Error::operator=(__return_storage_ptr__,&local_110);
      Error::~Error(&local_110);
      std::__cxx11::string::~string((string *)&local_130);
    }
    peerAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    Address::~Address((Address *)local_d8);
    if ((peerAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      Error::~Error(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  abort();
}

Assistant:

Error DtlsSession::SetClientTransportId()
{
    VerifyOrDie(mIsServer && !mIsClientIdSet);

    Error error;
    int   fail;
    auto  peerAddr = GetPeerAddr();

    VerifyOrExit(peerAddr.IsValid(), error = ERROR_INVALID_STATE("has no valid peer address"));

    fail = mbedtls_ssl_set_client_transport_id(&mSsl, reinterpret_cast<const uint8_t *>(peerAddr.GetRaw().data()),
                                               peerAddr.GetRaw().size());
    SuccessOrExit(error = ErrorFromMbedtlsError(fail));

    mIsClientIdSet = true;

exit:
    return error;
}